

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O3

string * SighashToStr_abi_cxx11_(string *__return_storage_ptr__,uchar sighash_type)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    p_Var2 = &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      bVar4 = (byte)(char)p_Var3[1]._M_color < sighash_type;
      if (!bVar4) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar4];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
        ) && ((byte)(char)p_Var2[1]._M_color <= sighash_type)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,p_Var2[1]._M_parent,
                   (long)&(p_Var2[1]._M_parent)->_M_color + (long)&(p_Var2[1]._M_left)->_M_color);
        return __return_storage_ptr__;
      }
      goto LAB_00d343d6;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
LAB_00d343d6:
  __stack_chk_fail();
}

Assistant:

std::string SighashToStr(unsigned char sighash_type)
{
    const auto& it = mapSigHashTypes.find(sighash_type);
    if (it == mapSigHashTypes.end()) return "";
    return it->second;
}